

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh.c
# Opt level: O2

void run_merge_count_task(work_item *work_item,size_t thread_id)

{
  work_item *pwVar1;
  work_item *pwVar2;
  work_item *pwVar3;
  work_item *pwVar4;
  work_fn_t p_Var5;
  
  work_item[2].next = (work_item *)0x0;
  work_item[3].work_fn = (work_fn_t)0x0;
  pwVar1 = work_item[1].next;
  pwVar4 = (work_item *)0x0;
  p_Var5 = (work_fn_t)0x0;
  for (pwVar3 = (work_item *)work_item[1].work_fn; pwVar3 < pwVar1;
      pwVar3 = (work_item *)((long)&pwVar3->work_fn + 1)) {
    pwVar2 = *(work_item **)(work_item[2].work_fn + (long)pwVar3 * 8);
    if (pwVar3 == *(work_item **)(work_item[2].work_fn + (long)pwVar2 * 8)) {
      pwVar4 = (work_item *)((long)&pwVar4->work_fn + (ulong)(pwVar3 < pwVar2));
      work_item[2].next = pwVar4;
    }
    else {
      p_Var5 = p_Var5 + 1;
      work_item[3].work_fn = p_Var5;
    }
  }
  return;
}

Assistant:

static void run_merge_count_task(struct work_item* work_item, size_t thread_id) {
    IGNORE(thread_id);
    struct merge_count_task* merge_count_task = (void*)work_item;
    merge_count_task->merged_count = merge_count_task->unmerged_count = 0;
    for (size_t i = merge_count_task->begin, n = merge_count_task->end; i < n; ++i) {
        size_t j = merge_count_task->neighbors[i];
        if (merge_count_task->neighbors[j] == i)
            merge_count_task->merged_count += i < j ? 1 : 0;
        else
            merge_count_task->unmerged_count++;
    }
}